

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_XMLNode * __thiscall
ON_XMLNodePrivate::GetNodeAtPath(ON_XMLNodePrivate *this,wchar_t *wszPath,bool bCreate)

{
  int iVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  long lVar4;
  undefined4 extraout_var;
  wchar_t *s2;
  ON_XMLNode *pOVar5;
  ulong uVar6;
  ChildIterator it;
  wchar_t wsz [261];
  
  std::recursive_mutex::lock(&this->m_mutex);
  if (wszPath == (wchar_t *)0x0) {
LAB_0067d051:
    pOVar5 = this->m_node;
LAB_0067d054:
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return pOVar5;
  }
LAB_0067cfb0:
  if (*wszPath == L'\0') goto LAB_0067d051;
  iVar1 = iswspace(*wszPath);
  if ((iVar1 != 0) || (*wszPath == L'/')) goto LAB_0067cfce;
  if (*wszPath == L'\0') goto LAB_0067d051;
  wcsncpy(wsz,wszPath,0x104);
  wsz[0x104] = L'\0';
  sVar2 = wcslen(wsz);
  uVar6 = sVar2 & 0xffffffff;
  while ((0 < (int)uVar6 && (iVar1 = iswspace(wsz[uVar6 - 1]), iVar1 != 0))) {
    wsz[uVar6 - 1] = L'\0';
    uVar6 = uVar6 - 1;
  }
  if (wsz[0] == L'\0') goto LAB_0067d051;
  pwVar3 = wcschr(wsz,L'/');
  uVar6 = (long)pwVar3 - (long)wsz;
  if ((int)(~uVar6 >> 2) == 0 || pwVar3 == (wchar_t *)0x0) {
    pwVar3 = (wchar_t *)0x0;
  }
  else {
    lVar4 = (long)(int)(uVar6 >> 2);
    pwVar3 = wsz + lVar4 + 1;
    wsz[lVar4] = L'\0';
  }
  (*this->m_node->_vptr_ON_XMLNode[0x2c])(&it);
  do {
    pOVar5 = (it._private)->_current;
    if (pOVar5 == (ON_XMLNode *)0x0) {
      if (bCreate) {
        pOVar5 = (ON_XMLNode *)operator_new(0xe8);
        ON_XMLNode::ON_XMLNode(pOVar5,wsz);
        bCreate = true;
        AttachChildNode(this,pOVar5);
        break;
      }
      pOVar5 = (ON_XMLNode *)0x0;
      goto LAB_0067d11a;
    }
    (it._private)->_current = pOVar5->_private->m_next_sibling;
    iVar1 = (*pOVar5->_vptr_ON_XMLNode[3])(pOVar5);
    s2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar1));
    iVar1 = on_wcsicmp(wsz,s2);
  } while (iVar1 != 0);
  pOVar5 = GetNodeAtPath(pOVar5->_private,pwVar3,bCreate);
LAB_0067d11a:
  ON_XMLNode::ChildIterator::~ChildIterator(&it);
  goto LAB_0067d054;
LAB_0067cfce:
  wszPath = wszPath + 1;
  goto LAB_0067cfb0;
}

Assistant:

ON_XMLNode* ON_XMLNodePrivate::GetNodeAtPath(const wchar_t* wszPath, bool bCreate)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  // Forward slash "/" is the separator.

  if (nullptr == wszPath)
    return &m_node;

  const wchar_t* p = wszPath;
  while (*p != 0)
  {
    if (!iswspace(*p) && *p != L'/')
      break;
    p++;
  }

  if (*p == 0)
    return &m_node; // The input string was empty.

  constexpr int maxBuf = 260;
  wchar_t wsz[maxBuf+1];
  wcsncpy(wsz, p, maxBuf);
  wsz[maxBuf] = 0;

  // Now right trim out the white space.
  const int iLength = (int)wcslen(wsz);

  for (int i = iLength - 1; i >= 0; i--)
  {
    if (iswspace(wsz[i]))
      wsz[i] = 0;
    else
      break;
  }

  // Check for a resultant empty string.
  if (*wsz == 0)
    return &m_node;

  const wchar_t* pNext = nullptr;
  const wchar_t* pstr = wcschr(wsz, L'/');

  const int pos = (pstr != nullptr) ? (int)(pstr - wsz) : -1;
  if (-1 != pos)
  {
    // sNext is the rest of the string that we're going to recurse through.
    pNext = wsz + pos + 1;
    wsz[pos] = 0;
  }

  auto it = m_node.GetChildIterator();
  ON_XMLNode* pChild = nullptr;
  while (nullptr != (pChild = it.GetNextChild()))
  {
    if (on_wcsicmp(wsz, pChild->TagName()) == 0)
    {
      return pChild->_private->GetNodeAtPath(pNext, bCreate);
    }
  }

  // The child was not found.
  if (bCreate)
  {
    return AttachChildNode(new ON_XMLNode(wsz))->_private->GetNodeAtPath(pNext, bCreate);
  }

  return nullptr;
}